

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.cpp
# Opt level: O1

char * __thiscall CppUnit::Exception::what(Exception *this)

{
  long *plVar1;
  pointer pcVar2;
  string *psVar3;
  undefined8 *puVar4;
  ulong uVar5;
  undefined8 uVar6;
  ulong *local_80;
  long local_78;
  ulong local_70 [2];
  long *local_60;
  undefined8 local_58;
  long local_50;
  undefined8 uStack_48;
  string local_40;
  
  psVar3 = Message::shortDescription_abi_cxx11_(&this->m_message);
  pcVar2 = (psVar3->_M_dataplus)._M_p;
  local_80 = local_70;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_80,pcVar2,pcVar2 + psVar3->_M_string_length);
  std::__cxx11::string::append((char *)&local_80);
  Message::details_abi_cxx11_(&local_40,&this->m_message);
  uVar5 = 0xf;
  if (local_80 != local_70) {
    uVar5 = local_70[0];
  }
  if (uVar5 < local_40._M_string_length + local_78) {
    uVar6 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      uVar6 = local_40.field_2._M_allocated_capacity;
    }
    if (local_40._M_string_length + local_78 <= (ulong)uVar6) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_40,0,(char *)0x0,(ulong)local_80);
      goto LAB_00121f68;
    }
  }
  puVar4 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_80,(ulong)local_40._M_dataplus._M_p);
LAB_00121f68:
  local_60 = &local_50;
  plVar1 = puVar4 + 2;
  if ((long *)*puVar4 == plVar1) {
    local_50 = *plVar1;
    uStack_48 = puVar4[3];
  }
  else {
    local_50 = *plVar1;
    local_60 = (long *)*puVar4;
  }
  local_58 = puVar4[1];
  *puVar4 = plVar1;
  puVar4[1] = 0;
  *(undefined1 *)plVar1 = 0;
  std::__cxx11::string::operator=((string *)&this->m_whatMessage,(string *)&local_60);
  if (local_60 != &local_50) {
    operator_delete(local_60,local_50 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if (local_80 != local_70) {
    operator_delete(local_80,local_70[0] + 1);
  }
  return (this->m_whatMessage)._M_dataplus._M_p;
}

Assistant:

const char*
Exception::what() const throw()
{
  Exception *mutableThis = CPPUNIT_CONST_CAST( Exception *, this );
  mutableThis->m_whatMessage = m_message.shortDescription() + "\n" + 
                               m_message.details();
  return m_whatMessage.c_str();
}